

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::eval_faceForward_vec3(ShaderEvalContext *c)

{
  undefined8 uVar1;
  int i;
  long lVar2;
  float res;
  float fVar3;
  Vector<float,_3> res_1;
  float local_3c [3];
  undefined8 local_30;
  float local_28;
  float local_24;
  undefined8 local_20;
  int aiStack_18 [6];
  
  local_3c[0] = c->in[0].m_data[2];
  uVar1 = *(undefined8 *)c->in[0].m_data;
  local_3c[1] = (float)uVar1;
  local_3c[2] = (float)((ulong)uVar1 >> 0x20);
  local_30 = *(undefined8 *)(c->in[1].m_data + 1);
  local_28 = c->in[1].m_data[0];
  local_24 = c->in[2].m_data[3];
  local_20 = *(undefined8 *)(c->in[2].m_data + 1);
  fVar3 = 0.0;
  lVar2 = 0;
  do {
    fVar3 = fVar3 + (&local_24)[lVar2] * *(float *)((long)&local_30 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (0.0 <= fVar3) {
    res_1.m_data[2] = 0.0;
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_1.m_data[lVar2] = -local_3c[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  else {
    res_1.m_data[2] = local_3c[2];
    res_1.m_data[0] = local_3c[0];
    res_1.m_data[1] = local_3c[1];
  }
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar2 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar2]] = res_1.m_data[lVar2 + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }